

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  int extraout_EDX;
  action_e action;
  Pl_Base64 decode;
  Pl_OStream out;
  
  if (argc == 2) {
    QUtil::binary_stdout();
    QUtil::binary_stdin();
    pcVar5 = argv[1];
    iVar2 = strcmp(pcVar5,"encode");
    if (iVar2 == 0) {
      action = a_encode;
    }
    else {
      iVar2 = strcmp(pcVar5,"decode");
      if (iVar2 != 0) goto LAB_0011b05a;
      action = a_decode;
    }
    Pl_OStream::Pl_OStream(&out,"stdout",(ostream *)&std::cout);
    Pl_Base64::Pl_Base64(&decode,"decode",&out.super_Pipeline,action);
    bVar1 = write_some(_stdin,1,&decode.super_Pipeline);
    if (bVar1) {
      bVar1 = write_some(_stdin,4,&decode.super_Pipeline);
      if (bVar1) {
        bVar1 = write_some(_stdin,2,&decode.super_Pipeline);
        if (bVar1) {
          bVar1 = write_some(_stdin,2,&decode.super_Pipeline);
          if (bVar1) {
            bVar1 = write_some(_stdin,7,&decode.super_Pipeline);
            if (bVar1) {
              bVar1 = write_some(_stdin,1,&decode.super_Pipeline);
              if (bVar1) {
                bVar1 = write_some(_stdin,9,&decode.super_Pipeline);
                if (bVar1) {
                  bVar1 = write_some(_stdin,2,&decode.super_Pipeline);
                  if (bVar1) {
                    do {
                      bVar1 = write_some(_stdin,1000,&decode.super_Pipeline);
                    } while (bVar1);
                  }
                }
              }
            }
          }
        }
      }
    }
    Pipeline::~Pipeline(&decode.super_Pipeline);
    Pl_OStream::~Pl_OStream(&out);
    return 0;
  }
LAB_0011b05a:
  usage();
  Pipeline::~Pipeline(&decode.super_Pipeline);
  Pl_OStream::~Pl_OStream(&out);
  if (extraout_EDX == 1) {
    plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar4 = std::operator<<((ostream *)&std::cout,"exception: ");
    pcVar5 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    if (argc != 2) {
        usage();
    }
    QUtil::binary_stdout();
    QUtil::binary_stdin();
    Pl_Base64::action_e action = Pl_Base64::a_decode;
    if (strcmp(argv[1], "encode") == 0) {
        action = Pl_Base64::a_encode;
    } else if (strcmp(argv[1], "decode") != 0) {
        usage();
    }

    try {
        Pl_OStream out("stdout", std::cout);
        Pl_Base64 decode("decode", &out, action);
        // The comments are "n: n%4 n%3", where n is the number of
        // bytes read at the end of the call, and are there to
        // indicate that we are reading in chunks that exercise
        // various boundary conditions around subsequent writes and
        // the state of buf and pos. There are some writes that don't
        // do flush at all, some that call flush multiple times, and
        // some that start in the middle and do flush, and this is
        // true for both encode and decode.
        if (write_some(stdin, 1, &decode) && //  1: 1 1
            write_some(stdin, 4, &decode) && //  5: 1 2
            write_some(stdin, 2, &decode) && //  7: 3 1
            write_some(stdin, 2, &decode) && //  9: 1 0
            write_some(stdin, 7, &decode) && // 16: 0 1
            write_some(stdin, 1, &decode) && // 17: 1 2
            write_some(stdin, 9, &decode) && // 26: 2 2
            write_some(stdin, 2, &decode)) { // 28: 0 1
            while (write_some(stdin, 1000, &decode)) {
            }
        }
    } catch (std::exception& e) {
        std::cout << "exception: " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}